

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::simple_collector<(pybind11::return_value_policy)1>::call
          (simple_collector<(pybind11::return_value_policy)1> *this,PyObject *ptr)

{
  PyObject *pPVar1;
  _object *ptr_00;
  undefined8 uVar2;
  undefined8 in_RDX;
  handle *in_RSI;
  handle in_RDI;
  PyObject *result;
  handle local_38;
  error_already_set *in_stack_ffffffffffffffd0;
  
  pPVar1 = handle::ptr(in_RSI);
  ptr_00 = (_object *)PyObject_CallObject(in_RDX,pPVar1);
  if (ptr_00 == (_object *)0x0) {
    uVar2 = __cxa_allocate_exception(0x18);
    error_already_set::error_already_set(in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle<_object_*,_0>(&local_38,ptr_00);
  reinterpret_steal<pybind11::object>(in_RDI);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object call(PyObject *ptr) const {
        PyObject *result = PyObject_CallObject(ptr, m_args.ptr());
        if (!result) {
            throw error_already_set();
        }
        return reinterpret_steal<object>(result);
    }